

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O3

bool __thiscall FIX::SocketMonitor::addWrite(SocketMonitor *this,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int local_14;
  
  p_Var2 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (s <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < s];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= s)) {
      socket_setnonblock(s);
      p_Var2 = (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var2 != (_Base_ptr)0x0) {
        p_Var1 = &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = &p_Var1->_M_header;
        do {
          if (s <= (int)p_Var2[1]._M_color) {
            p_Var3 = p_Var2;
          }
          p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < s];
        } while (p_Var2 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= s)) {
          return false;
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->m_writeSockets,&local_14);
      return true;
    }
  }
  return false;
}

Assistant:

bool SocketMonitor::addWrite(socket_handle s) {
  if (m_readSockets.find(s) == m_readSockets.end()) {
    return false;
  }

  socket_setnonblock(s);
  Sockets::iterator i = m_writeSockets.find(s);
  if (i != m_writeSockets.end()) {
    return false;
  }

  m_writeSockets.insert(s);
  return true;
}